

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::DebugStringFieldValuePrinter::PrintMessageStart
          (DebugStringFieldValuePrinter *this,Message *param_1,int param_2,int param_3,
          bool single_line_mode,BaseTextGenerator *generator)

{
  char *pcVar1;
  undefined7 in_register_00000081;
  TextGenerator *text_generator;
  StringPiece text_head;
  StringPiece text_tail;
  
  pcVar1 = "{\n";
  if ((int)CONCAT71(in_register_00000081,single_line_mode) != 0) {
    pcVar1 = "{ ";
  }
  text_head.length_ = 1;
  text_head.ptr_ = " ";
  text_tail.length_ = 2;
  text_tail.ptr_ = pcVar1;
  TextGenerator::PrintMaybeWithMarker((TextGenerator *)generator,text_head,text_tail);
  return;
}

Assistant:

void PrintMessageStart(const Message& /*message*/, int /*field_index*/,
                         int /*field_count*/, bool single_line_mode,
                         BaseTextGenerator* generator) const override {
    // This is safe as only TextGenerator is used with
    // DebugStringFieldValuePrinter.
    TextGenerator* text_generator = static_cast<TextGenerator*>(generator);
    if (single_line_mode) {
      text_generator->PrintMaybeWithMarker(" ", "{ ");
    } else {
      text_generator->PrintMaybeWithMarker(" ", "{\n");
    }
  }